

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats.c
# Opt level: O1

parasail_result_t *
parasail_sw_stats_rowcol
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int *piVar9;
  int iVar10;
  parasail_result_t *ppVar11;
  int *ptr;
  int *ptr_00;
  int *ptr_01;
  int *ptr_02;
  int *ptr_03;
  int *ptr_04;
  int *ptr_05;
  int *ptr_06;
  int *ptr_07;
  int *ptr_08;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  int a;
  int iVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  bool bVar25;
  int NWL;
  int NWS;
  int NWM;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  ulong local_f0;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  
  if (_s2 == (char *)0x0) {
    parasail_sw_stats_rowcol_cold_8();
  }
  else if (s2Len < 1) {
    parasail_sw_stats_rowcol_cold_7();
  }
  else if (open < 0) {
    parasail_sw_stats_rowcol_cold_6();
  }
  else if (gap < 0) {
    parasail_sw_stats_rowcol_cold_5();
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    parasail_sw_stats_rowcol_cold_4();
  }
  else {
    local_f0 = (ulong)(uint)_s1Len;
    if (matrix->type == 1) {
      if (_s1 == (char *)0x0) {
        parasail_sw_stats_rowcol_cold_3();
        return (parasail_result_t *)0x0;
      }
    }
    else {
      if (_s1 == (char *)0x0) {
        parasail_sw_stats_rowcol_cold_2();
        return (parasail_result_t *)0x0;
      }
      if (_s1Len < 1) {
        parasail_sw_stats_rowcol_cold_1();
        return (parasail_result_t *)0x0;
      }
    }
    if (matrix->type != 0) {
      local_f0 = (ulong)(uint)matrix->length;
    }
    a = (int)local_f0;
    ppVar11 = parasail_result_new_rowcol3(a,s2Len);
    if (ppVar11 != (parasail_result_t *)0x0) {
      ppVar11->flag = ppVar11->flag | 0x1450104;
      ptr = parasail_memalign_int(0x10,(long)a);
      ptr_00 = parasail_memalign_int(0x10,(ulong)(uint)s2Len);
      uVar14 = (ulong)(s2Len + 1);
      ptr_01 = parasail_memalign_int(0x10,uVar14);
      ptr_02 = parasail_memalign_int(0x10,uVar14);
      ptr_03 = parasail_memalign_int(0x10,uVar14);
      ptr_04 = parasail_memalign_int(0x10,uVar14);
      ptr_05 = parasail_memalign_int(0x10,uVar14);
      ptr_06 = parasail_memalign_int(0x10,uVar14);
      ptr_07 = parasail_memalign_int(0x10,uVar14);
      ptr_08 = parasail_memalign_int(0x10,uVar14);
      if ((ptr_08 != (int *)0x0 && (ptr_07 != (int *)0x0 && ptr_06 != (int *)0x0)) &&
          ((ptr_05 != (int *)0x0 && (ptr_04 != (int *)0x0 && ptr_03 != (int *)0x0)) &&
          ((ptr_02 != (int *)0x0 && ptr_01 != (int *)0x0) &&
          (ptr_00 != (int *)0x0 && ptr != (int *)0x0)))) {
        if (0 < a) {
          piVar9 = matrix->mapper;
          uVar14 = 0;
          do {
            ptr[uVar14] = piVar9[(byte)_s1[uVar14]];
            uVar14 = uVar14 + 1;
          } while (local_f0 != uVar14);
        }
        piVar9 = matrix->mapper;
        uVar14 = 1;
        if (1 < s2Len) {
          uVar14 = (ulong)(uint)s2Len;
        }
        uVar12 = 0;
        do {
          ptr_00[uVar12] = piVar9[(byte)_s2[uVar12]];
          uVar12 = uVar12 + 1;
        } while (uVar14 != uVar12);
        *ptr_01 = 0;
        *ptr_02 = 0;
        *ptr_03 = 0;
        *ptr_04 = 0;
        *ptr_05 = -0x40000000;
        *ptr_06 = 0;
        *ptr_07 = 0;
        *ptr_08 = 0;
        lVar15 = 0;
        do {
          *(undefined4 *)((long)ptr_01 + lVar15 + 4) = 0;
          *(undefined4 *)((long)ptr_02 + lVar15 + 4) = 0;
          *(undefined4 *)((long)ptr_03 + lVar15 + 4) = 0;
          *(undefined4 *)((long)ptr_04 + lVar15 + 4) = 0;
          *(undefined4 *)((long)ptr_05 + lVar15 + 4) = 0xc0000000;
          *(undefined4 *)((long)ptr_06 + lVar15 + 4) = 0;
          *(undefined4 *)((long)ptr_07 + lVar15 + 4) = 0;
          *(undefined4 *)((long)ptr_08 + lVar15 + 4) = 0;
          lVar15 = lVar15 + 4;
        } while (uVar14 * 4 - lVar15 != 0);
        local_fc = s2Len;
        if (a < 1) {
          local_f8 = -0x40000000;
          local_104 = -0x40000000;
          local_108 = -0x40000000;
          local_100 = -0x40000000;
        }
        else {
          local_100 = -0x40000000;
          uVar12 = 1;
          local_108 = -0x40000000;
          local_104 = -0x40000000;
          local_f8 = -0x40000000;
          do {
            if (matrix->type == 0) {
              iVar1 = matrix->size;
              lVar15 = (long)ptr[uVar12 - 1];
            }
            else {
              iVar1 = matrix->size;
              lVar15 = uVar12 - 1;
            }
            piVar9 = matrix->matrix;
            iVar24 = *ptr_01;
            iVar2 = *ptr_02;
            iVar3 = *ptr_03;
            local_f4 = *ptr_04;
            *ptr_01 = 0;
            *ptr_02 = 0;
            *ptr_03 = 0;
            local_c0 = 0;
            *ptr_04 = 0;
            local_bc = -0x40000000;
            local_c4 = 0;
            local_c8 = 0;
            iVar13 = 0;
            iVar16 = 0;
            iVar17 = 0;
            iVar23 = 0;
            uVar19 = 1;
            do {
              iVar4 = ptr_01[uVar19];
              iVar5 = ptr_02[uVar19];
              iVar6 = ptr_03[uVar19];
              iVar22 = iVar4 - open;
              iVar18 = ptr_05[uVar19] - gap;
              iVar8 = iVar18;
              if (iVar18 < iVar22) {
                iVar8 = iVar22;
              }
              iVar7 = ptr_04[uVar19];
              ptr_05[uVar19] = iVar8;
              iVar21 = iVar23 - open;
              iVar10 = local_bc - gap;
              local_bc = iVar21;
              if (iVar21 <= iVar10) {
                local_bc = iVar10;
              }
              iVar24 = iVar24 + piVar9[lVar15 * iVar1 + (long)ptr_00[uVar19 - 1]];
              iVar20 = iVar24;
              if (iVar24 <= local_bc) {
                iVar20 = local_bc;
              }
              if (iVar20 <= iVar8) {
                iVar20 = iVar8;
              }
              iVar23 = iVar20;
              if (iVar20 < 1) {
                iVar23 = 0;
              }
              if (iVar18 < iVar22) {
                ptr_06[uVar19] = iVar5;
                ptr_07[uVar19] = iVar6;
                ptr_08[uVar19] = iVar7;
              }
              iVar8 = ptr_08[uVar19];
              ptr_08[uVar19] = iVar8 + 1;
              iVar18 = iVar17;
              iVar22 = iVar16;
              if (iVar21 <= iVar10) {
                iVar18 = local_c8;
                iVar13 = local_c0;
                iVar22 = local_c4;
              }
              local_c0 = iVar13 + 1;
              if (iVar23 == iVar24) {
                iVar17 = iVar2 + (uint)(ptr[uVar12 - 1] == ptr_00[uVar19 - 1]);
                iVar13 = local_f4 + 1;
                iVar16 = iVar3 + (uint)(0 < piVar9[lVar15 * iVar1 + (long)ptr_00[uVar19 - 1]]);
              }
              else {
                iVar17 = iVar18;
                iVar13 = local_c0;
                iVar16 = iVar22;
                if (iVar23 == ptr_05[uVar19]) {
                  iVar17 = ptr_06[uVar19];
                  iVar16 = ptr_07[uVar19];
                  iVar13 = iVar8 + 1;
                }
              }
              if (iVar20 < 1) {
                iVar23 = 0;
                iVar17 = 0;
                iVar16 = 0;
                iVar13 = 0;
              }
              ptr_01[uVar19] = iVar23;
              ptr_02[uVar19] = iVar17;
              ptr_03[uVar19] = iVar16;
              ptr_04[uVar19] = iVar13;
              iVar24 = iVar23;
              if ((local_f8 < iVar23) ||
                 ((iVar23 == local_f8 && (iVar24 = local_f8, (long)uVar19 <= (long)local_fc)))) {
                local_f8 = iVar24;
                local_f0 = (ulong)((int)uVar12 - 1);
                local_108 = iVar16;
                local_104 = iVar17;
                local_100 = iVar13;
                local_fc = (int)uVar19 + -1;
              }
              bVar25 = uVar19 != uVar14;
              uVar19 = uVar19 + 1;
              iVar24 = iVar4;
              local_f4 = iVar7;
              local_c8 = iVar18;
              local_c4 = iVar22;
              iVar2 = iVar5;
              iVar3 = iVar6;
            } while (bVar25);
            *(int *)(*(long *)((long)((ppVar11->field_4).trace)->trace_del_table + 0x20) + -4 +
                    uVar12 * 4) = iVar23;
            *(int *)(*(long *)((long)((ppVar11->field_4).trace)->trace_del_table + 0x28) + -4 +
                    uVar12 * 4) = iVar17;
            *(int *)(*(long *)((long)((ppVar11->field_4).trace)->trace_del_table + 0x30) + -4 +
                    uVar12 * 4) = iVar16;
            *(int *)(*(long *)((long)((ppVar11->field_4).trace)->trace_del_table + 0x38) + -4 +
                    uVar12 * 4) = iVar13;
            uVar12 = uVar12 + 1;
          } while (uVar12 != a + 1);
        }
        uVar14 = 1;
        if (1 < s2Len) {
          uVar14 = (ulong)(uint)s2Len;
        }
        lVar15 = 0;
        do {
          *(undefined4 *)(*((ppVar11->field_4).trace)->trace_del_table + lVar15) =
               *(undefined4 *)((long)ptr_01 + lVar15 + 4);
          *(undefined4 *)(*(long *)((long)((ppVar11->field_4).trace)->trace_del_table + 8) + lVar15)
               = *(undefined4 *)((long)ptr_02 + lVar15 + 4);
          *(undefined4 *)
           (*(long *)((long)((ppVar11->field_4).trace)->trace_del_table + 0x10) + lVar15) =
               *(undefined4 *)((long)ptr_03 + lVar15 + 4);
          *(undefined4 *)
           (*(long *)((long)((ppVar11->field_4).trace)->trace_del_table + 0x18) + lVar15) =
               *(undefined4 *)((long)ptr_04 + lVar15 + 4);
          lVar15 = lVar15 + 4;
        } while (uVar14 * 4 != lVar15);
        ppVar11->score = local_f8;
        ppVar11->end_query = (int)local_f0;
        ppVar11->end_ref = local_fc;
        ((ppVar11->field_4).stats)->matches = local_104;
        ((ppVar11->field_4).stats)->similar = local_108;
        ((ppVar11->field_4).stats)->length = local_100;
        parasail_free(ptr_08);
        parasail_free(ptr_07);
        parasail_free(ptr_06);
        parasail_free(ptr_05);
        parasail_free(ptr_04);
        parasail_free(ptr_03);
        parasail_free(ptr_02);
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        return ppVar11;
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* ENAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    parasail_result_t *result = NULL;
    int * restrict s1 = NULL;
    int * restrict s2 = NULL;
    int * restrict H = NULL;
    int * restrict HM = NULL;
    int * restrict HS = NULL;
    int * restrict HL = NULL;
    int * restrict F = NULL;
    int * restrict FM = NULL;
    int * restrict FS = NULL;
    int * restrict FL = NULL;
    int i = 0;
    int j = 0;
    int s1Len = 0;
    int score = 0;
    int matches = 0;
    int similar = 0;
    int length = 0;
    int end_query = 0;
    int end_ref = 0;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    i = 0;
    j = 0;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    score = NEG_INF_32;
    matches = NEG_INF_32;
    similar = NEG_INF_32;
    length = NEG_INF_32;
    end_query = s1Len;
    end_ref = s2Len;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_NOVEC
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_INT | PARASAIL_FLAG_LANES_1;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1 = parasail_memalign_int(16, s1Len);
    s2 = parasail_memalign_int(16, s2Len);
    H  = parasail_memalign_int(16, s2Len+1);
    HM = parasail_memalign_int(16, s2Len+1);
    HS = parasail_memalign_int(16, s2Len+1);
    HL = parasail_memalign_int(16, s2Len+1);
    F  = parasail_memalign_int(16, s2Len+1);
    FM = parasail_memalign_int(16, s2Len+1);
    FS = parasail_memalign_int(16, s2Len+1);
    FL = parasail_memalign_int(16, s2Len+1);

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2) return NULL;
    if (!H) return NULL;
    if (!HM) return NULL;
    if (!HS) return NULL;
    if (!HL) return NULL;
    if (!F) return NULL;
    if (!FM) return NULL;
    if (!FS) return NULL;
    if (!FL) return NULL;

    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }

    /* upper left corner */
    H[0] = 0;
    HM[0] = 0;
    HS[0] = 0;
    HL[0] = 0;
    F[0] = NEG_INF_32;
    FM[0] = 0;
    FS[0] = 0;
    FL[0] = 0;
    
    /* first row */
    for (j=1; j<=s2Len; ++j) {
        H[j] = 0;
        HM[j] = 0;
        HS[j] = 0;
        HL[j] = 0;
        F[j] = NEG_INF_32;
        FM[j] = 0;
        FS[j] = 0;
        FL[j] = 0;
    }

    /* iter over first sequence */
    for (i=1; i<=s1Len; ++i) {
        const int * const restrict matrow =
            matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
            &matrix->matrix[matrix->size*s1[i-1]] :
            &matrix->matrix[matrix->size*(i-1)];
        /* init first column */
        int NH = H[0];
        int NHM = HM[0];
        int NHS = HS[0];
        int NHL = HL[0];
        int WH = 0;
        int WHM = 0;
        int WHS = 0;
        int WHL = 0;
        int E = NEG_INF_32;
        int EM = 0;
        int ES = 0;
        int EL = 0;
        H[0] = WH;
        HM[0] = WHM;
        HS[0] = WHS;
        HL[0] = WHL;
        for (j=1; j<=s2Len; ++j) {
            int H_dag;
            int E_opn;
            int E_ext;
            int F_opn;
            int F_ext;
            int NWH = NH;
            int NWM = NHM;
            int NWS = NHS;
            int NWL = NHL;
            NH = H[j];
            NHM = HM[j];
            NHS = HS[j];
            NHL = HL[j];
            F_opn = NH - open;
            F_ext  = F[j] - gap;
            F[j]  = MAX(F_opn, F_ext);
            E_opn = WH - open;
            E_ext = E - gap;
            E = MAX(E_opn, E_ext);
            H_dag = NWH + matrow[s2[j-1]];
            WH = MAX(H_dag, 0);
            WH = MAX(WH, E);
            WH = MAX(WH, F[j]);
            if (F_opn > F_ext) {
                FM[j] = NHM;
                FS[j] = NHS;
                FL[j] = NHL;
            }
            FL[j] += 1;
            if (E_opn > E_ext) {
                EM = WHM;
                ES = WHS;
                EL = WHL;
            }
            EL += 1;
            if (WH == H_dag) {
                WHM  = NWM + (s1[i-1] == s2[j-1]);
                WHS  = NWS + (matrow[s2[j-1]] > 0);
                WHL  = NWL + 1;
            }
            else if (WH == F[j]) {
                WHM  = FM[j];
                WHS  = FS[j];
                WHL  = FL[j];
            }
            else {
                WHM  = EM;
                WHS  = ES;
                WHL  = EL;
            }
            if (WH <= 0) {
                WH = 0;
                WHM = 0;
                WHS = 0;
                WHL = 0;
            }
            H[j] = WH;
            HM[j] = WHM;
            HS[j] = WHS;
            HL[j] = WHL;
#ifdef PARASAIL_TABLE
            result->stats->tables->score_table[1LL*(i-1)*s2Len + (j-1)] = WH;
            result->stats->tables->matches_table[1LL*(i-1)*s2Len + (j-1)] = WHM;
            result->stats->tables->similar_table[1LL*(i-1)*s2Len + (j-1)] = WHS;
            result->stats->tables->length_table[1LL*(i-1)*s2Len + (j-1)] = WHL;
#endif
            if (WH > score) {
                score = WH;
                matches = WHM;
                similar = WHS;
                length = WHL;
                end_query = i-1;
                end_ref = j-1;
            }
            else if (score == WH && j-1 < end_ref) {
                matches = WHM;
                similar = WHS;
                length = WHL;
                end_query = i-1;
                end_ref = j-1;
            }
        }
#ifdef PARASAIL_ROWCOL
        result->stats->rowcols->score_col[i-1] = WH;
        result->stats->rowcols->matches_col[i-1] = WHM;
        result->stats->rowcols->similar_col[i-1] = WHS;
        result->stats->rowcols->length_col[i-1] = WHL;
#endif
    }
#ifdef PARASAIL_ROWCOL
    for (j=1; j<=s2Len; ++j) {
        result->stats->rowcols->score_row[j-1] = H[j];
        result->stats->rowcols->matches_row[j-1] = HM[j];
        result->stats->rowcols->similar_row[j-1] = HS[j];
        result->stats->rowcols->length_row[j-1] = HL[j];
    }
#endif

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(FL);
    parasail_free(FS);
    parasail_free(FM);
    parasail_free(F);
    parasail_free(HL);
    parasail_free(HS);
    parasail_free(HM);
    parasail_free(H);
    parasail_free(s2);
    parasail_free(s1);

    return result;
}